

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O2

uint32_t __thiscall
ddd::DictionarySGL<false,_false>::delete_key(DictionarySGL<false,_false> *this,char *key)

{
  bool bVar1;
  Query query;
  
  query.pos_ = 0;
  query.value_ = 0x7fffffff;
  query.node_pos_ = 0;
  query.is_finished_ = false;
  query.key_ = key;
  bVar1 = DaTrie<false,_false,_false>::delete_key
                    ((this->trie_)._M_t.
                     super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                     .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl,
                     &query);
  if (bVar1) {
    this->num_keys_ = this->num_keys_ - 1;
  }
  else {
    query.value_ = 0xffffffff;
  }
  return query.value_;
}

Assistant:

uint32_t delete_key(const char* key) {
    Query query(key);
    if (!trie_->delete_key(query)) {
      return NOT_FOUND;
    }
    --num_keys_;
    return query.value();
  }